

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::DebuggerScope::IsBlockScope(DebuggerScope *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool local_19;
  DebuggerScope *this_local;
  
  if (this->scopeType == DiagBlockScopeRangeEnd) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1761,"(this->scopeType != Js::DiagBlockScopeRangeEnd)",
                                "Debugger scope type should never be set to range end - only reserved for marking the end of a scope (not persisted)."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_19 = true;
  if (((this->scopeType != DiagBlockScopeDirect) &&
      (local_19 = true, this->scopeType != DiagBlockScopeInObject)) &&
     (local_19 = true, this->scopeType != DiagBlockScopeInSlot)) {
    local_19 = this->scopeType == DiagBlockScopeRangeEnd;
  }
  return local_19;
}

Assistant:

bool DebuggerScope::IsBlockScope() const
    {
        AssertMsg(this->scopeType != Js::DiagBlockScopeRangeEnd, "Debugger scope type should never be set to range end - only reserved for marking the end of a scope (not persisted).");
        return this->scopeType == Js::DiagBlockScopeDirect
            || this->scopeType == Js::DiagBlockScopeInObject
            || this->scopeType == Js::DiagBlockScopeInSlot
            || this->scopeType == Js::DiagBlockScopeRangeEnd;
    }